

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::B44Compressor::uncompress
          (B44Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined4 *in_RCX;
  int in_EDX;
  uchar *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  int n_3;
  ChannelData *cd_3;
  int i_3;
  int y_2;
  int n_2;
  int x_1;
  ChannelData *cd_2;
  int i_2;
  int y_1;
  char *outEnd;
  int n_1;
  unsigned_short s [16];
  int x;
  unsigned_short *row3;
  unsigned_short *row2;
  unsigned_short *row1;
  unsigned_short *row0;
  int y;
  int n;
  ChannelData *cd_1;
  int i_1;
  ChannelData *cd;
  ConstIterator c;
  int i;
  unsigned_short *tmpBufferEnd;
  int maxY;
  int minY;
  int maxX;
  int minX;
  undefined4 in_stack_fffffffffffffed8;
  undefined2 in_stack_fffffffffffffedc;
  unsigned_short in_stack_fffffffffffffede;
  ConstIterator *in_stack_fffffffffffffee0;
  int local_f8;
  int local_f4;
  int local_ec;
  int local_e0;
  int local_dc;
  void *local_d8;
  unsigned_short local_c8 [4];
  undefined1 auStack_c0 [8];
  undefined1 auStack_b8 [8];
  undefined1 auStack_b0 [12];
  int local_a4;
  void *local_a0;
  void *local_98;
  void *local_90;
  void *local_88;
  int local_80;
  int local_7c;
  long *local_78;
  int local_6c;
  long *local_68;
  const_iterator local_60;
  const_iterator local_58;
  int local_4c;
  long local_48;
  int local_40;
  int local_3c;
  int local_38;
  undefined4 local_34;
  undefined8 *local_30;
  int local_1c;
  uchar *local_18;
  int local_4;
  
  *in_R8 = *(undefined8 *)(in_RDI + 0x28);
  if (in_EDX == 0) {
    local_4 = 0;
  }
  else {
    local_34 = *in_RCX;
    local_30 = in_R8;
    local_1c = in_EDX;
    local_18 = in_RSI;
    piVar3 = std::min<int>(in_RCX + 2,(int *)(in_RDI + 0x4c));
    local_38 = *piVar3;
    local_3c = in_RCX[1];
    piVar3 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 0x50));
    local_40 = *piVar3;
    local_48 = *(long *)(in_RDI + 0x20);
    local_4c = 0;
    local_58._M_node =
         (_Base_ptr)
         ChannelList::begin((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffede,
                                     CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)))
    ;
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           ChannelList::end((ChannelList *)
                            CONCAT26(in_stack_fffffffffffffede,
                                     CONCAT24(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8)))
      ;
      bVar1 = Imf_2_5::operator!=(in_stack_fffffffffffffee0,
                                  (ConstIterator *)
                                  CONCAT26(in_stack_fffffffffffffede,
                                           CONCAT24(in_stack_fffffffffffffedc,
                                                    in_stack_fffffffffffffed8)));
      if (!bVar1) break;
      local_68 = (long *)(*(long *)(in_RDI + 0x40) + (long)local_4c * 0x28);
      *local_68 = local_48;
      local_68[1] = *local_68;
      ChannelList::ConstIterator::channel((ConstIterator *)0xa5b3cb);
      iVar2 = numSamples((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (int)in_stack_fffffffffffffee0,
                         CONCAT22(in_stack_fffffffffffffede,in_stack_fffffffffffffedc));
      *(int *)(local_68 + 2) = iVar2;
      ChannelList::ConstIterator::channel((ConstIterator *)0xa5b3fb);
      iVar2 = numSamples((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (int)in_stack_fffffffffffffee0,
                         CONCAT22(in_stack_fffffffffffffede,in_stack_fffffffffffffedc));
      *(int *)((long)local_68 + 0x14) = iVar2;
      local_48 = local_48 +
                 (long)((int)local_68[2] * *(int *)((long)local_68 + 0x14) *
                       *(int *)((long)local_68 + 0x24)) * 2;
      ChannelList::ConstIterator::operator++(in_stack_fffffffffffffee0);
      local_4c = local_4c + 1;
    }
    for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x30); local_6c = local_6c + 1) {
      local_78 = (long *)(*(long *)(in_RDI + 0x40) + (long)local_6c * 0x28);
      if (*(int *)((long)local_78 + 0x1c) == 1) {
        for (local_80 = 0; local_80 < *(int *)((long)local_78 + 0x14); local_80 = local_80 + 4) {
          local_88 = (void *)(*local_78 + (long)(local_80 * (int)local_78[2]) * 2);
          local_90 = (void *)((long)local_88 + (long)(int)local_78[2] * 2);
          local_98 = (void *)((long)local_90 + (long)(int)local_78[2] * 2);
          local_a0 = (void *)((long)local_98 + (long)(int)local_78[2] * 2);
          for (local_a4 = 0; local_a4 < (int)local_78[2]; local_a4 = local_a4 + 4) {
            if (local_1c < 3) {
              anon_unknown_0::notEnoughData();
            }
            if (local_18[2] == 0xfc) {
              anon_unknown_0::unpack3(local_18,local_c8);
              local_18 = local_18 + 3;
              local_1c = local_1c + -3;
            }
            else {
              if (local_1c < 0xe) {
                anon_unknown_0::notEnoughData();
              }
              anon_unknown_0::unpack14(local_18,local_c8);
              local_18 = local_18 + 0xe;
              local_1c = local_1c + -0xe;
            }
            if ((*(byte *)(local_78 + 4) & 1) != 0) {
              anon_unknown_0::convertToLinear(local_c8);
            }
            if (local_a4 + 3 < (int)local_78[2]) {
              in_stack_fffffffffffffee0 = (ConstIterator *)0x8;
            }
            else {
              in_stack_fffffffffffffee0 =
                   (ConstIterator *)((long)((int)local_78[2] - local_a4) << 1);
            }
            iVar2 = (int)in_stack_fffffffffffffee0;
            if (local_80 + 3 < *(int *)((long)local_78 + 0x14)) {
              memcpy(local_88,local_c8,(long)iVar2);
              memcpy(local_90,auStack_c0,(long)iVar2);
              memcpy(local_98,auStack_b8,(long)iVar2);
              memcpy(local_a0,auStack_b0,(long)iVar2);
            }
            else {
              memcpy(local_88,local_c8,(long)iVar2);
              if (local_80 + 1 < *(int *)((long)local_78 + 0x14)) {
                memcpy(local_90,auStack_c0,(long)iVar2);
              }
              if (local_80 + 2 < *(int *)((long)local_78 + 0x14)) {
                memcpy(local_98,auStack_b8,(long)iVar2);
              }
            }
            local_88 = (void *)((long)local_88 + 8);
            local_90 = (void *)((long)local_90 + 8);
            local_98 = (void *)((long)local_98 + 8);
            local_a0 = (void *)((long)local_a0 + 8);
          }
        }
      }
      else {
        local_7c = (int)local_78[2] * *(int *)((long)local_78 + 0x14) *
                   *(int *)((long)local_78 + 0x24) * 2;
        if (local_1c < local_7c) {
          anon_unknown_0::notEnoughData();
        }
        memcpy((void *)*local_78,local_18,(long)local_7c);
        local_18 = local_18 + local_7c;
        local_1c = local_1c - local_7c;
      }
    }
    local_d8 = *(void **)(in_RDI + 0x28);
    if (*(int *)(in_RDI + 0x18) == 1) {
      for (local_dc = local_3c; local_dc <= local_40; local_dc = local_dc + 1) {
        for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x30); local_e0 = local_e0 + 1) {
          lVar4 = *(long *)(in_RDI + 0x40) + (long)local_e0 * 0x28;
          iVar2 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                  (int)in_stack_fffffffffffffee0);
          if (iVar2 == 0) {
            if (*(int *)(lVar4 + 0x1c) == 1) {
              for (local_ec = *(int *)(lVar4 + 0x10); 0 < local_ec; local_ec = local_ec + -1) {
                Xdr::write<Imf_2_5::CharPtrIO,char*>
                          ((char **)in_stack_fffffffffffffee0,in_stack_fffffffffffffede);
                *(long *)(lVar4 + 8) = *(long *)(lVar4 + 8) + 2;
              }
            }
            else {
              iVar2 = *(int *)(lVar4 + 0x10) * *(int *)(lVar4 + 0x24);
              memcpy(local_d8,*(void **)(lVar4 + 8),(long)iVar2 << 1);
              local_d8 = (void *)((long)iVar2 * 2 + (long)local_d8);
              *(long *)(lVar4 + 8) = *(long *)(lVar4 + 8) + (long)iVar2 * 2;
            }
          }
        }
      }
    }
    else {
      for (local_f4 = local_3c; local_f4 <= local_40; local_f4 = local_f4 + 1) {
        for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x30); local_f8 = local_f8 + 1) {
          lVar4 = *(long *)(in_RDI + 0x40) + (long)local_f8 * 0x28;
          iVar2 = Imath_2_5::modp((int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                                  (int)in_stack_fffffffffffffee0);
          if (iVar2 == 0) {
            iVar2 = *(int *)(lVar4 + 0x10) * *(int *)(lVar4 + 0x24);
            memcpy(local_d8,*(void **)(lVar4 + 8),(long)iVar2 << 1);
            local_d8 = (void *)((long)iVar2 * 2 + (long)local_d8);
            *(long *)(lVar4 + 8) = *(long *)(lVar4 + 8) + (long)iVar2 * 2;
          }
        }
      }
    }
    if (0 < local_1c) {
      anon_unknown_0::tooMuchData();
    }
    *local_30 = *(undefined8 *)(in_RDI + 0x28);
    local_4 = (int)local_d8 - (int)*(undefined8 *)(in_RDI + 0x28);
  }
  return local_4;
}

Assistant:

int
B44Compressor::uncompress (const char *inPtr,
			   int inSize,
			   IMATH_NAMESPACE::Box2i range,
			   const char *&outPtr)
{
    //
    // This function is the reverse of the compress() function,
    // above.  First all pixels are moved from the input buffer
    // into _tmpBuffer.  UINT and FLOAT channels are copied
    // verbatim; HALF channels are uncompressed in blocks of
    // 4x4 pixels.  Then the pixels in _tmpBuffer are copied
    // into the output buffer and rearranged such that the data
    // for for each scan line form a contiguous block.
    //

    outPtr = _outBuffer;

    if (inSize == 0)
    {
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);
    
    unsigned short *tmpBufferEnd = _tmpBuffer;
    int i = 0;

    for (ChannelList::ConstIterator c = _channels.begin();
	 c != _channels.end();
	 ++c, ++i)
    {
	ChannelData &cd = _channelData[i];

	cd.start = tmpBufferEnd;
	cd.end = cd.start;

	cd.nx = numSamples (c.channel().xSampling, minX, maxX);
	cd.ny = numSamples (c.channel().ySampling, minY, maxY);

	tmpBufferEnd += cd.nx * cd.ny * cd.size;
    }

    for (int i = 0; i < _numChans; ++i)
    {
	ChannelData &cd = _channelData[i];

	if (cd.type != HALF)
	{
	    //
	    // UINT or FLOAT channel.
	    //

	    int n = cd.nx * cd.ny * cd.size * sizeof (unsigned short);

	    if (inSize < n)
		notEnoughData();

	    memcpy (cd.start, inPtr, n);
	    inPtr += n;
	    inSize -= n;

	    continue;
	}

	//
	// HALF channel
	//

	for (int y = 0; y < cd.ny; y += 4)
	{
	    unsigned short *row0 = cd.start + y * cd.nx;
	    unsigned short *row1 = row0 + cd.nx;
	    unsigned short *row2 = row1 + cd.nx;
	    unsigned short *row3 = row2 + cd.nx;

	    for (int x = 0; x < cd.nx; x += 4)
	    {
		unsigned short s[16]; 

		if (inSize < 3)
		    notEnoughData();

		if (((const unsigned char *)inPtr)[2] == 0xfc)
		{
		    unpack3 ((const unsigned char *)inPtr, s);
		    inPtr += 3;
		    inSize -= 3;
		}
		else
		{
		    if (inSize < 14)
			notEnoughData();

		    unpack14 ((const unsigned char *)inPtr, s);
		    inPtr += 14;
		    inSize -= 14;
		}

		if (cd.pLinear)
		    convertToLinear (s);

		int n = (x + 3 < cd.nx)?
			    4 * sizeof (unsigned short) :
			    (cd.nx - x) * sizeof (unsigned short);

		if (y + 3 < cd.ny)
		{
		    memcpy (row0, &s[ 0], n);
		    memcpy (row1, &s[ 4], n);
		    memcpy (row2, &s[ 8], n);
		    memcpy (row3, &s[12], n);
		}
		else
		{
		    memcpy (row0, &s[ 0], n);

		    if (y + 1 < cd.ny)
			memcpy (row1, &s[ 4], n);

		    if (y + 2 < cd.ny)
			memcpy (row2, &s[ 8], n);
		}

		row0 += 4;
		row1 += 4;
		row2 += 4;
		row3 += 4;
	    }
	}
    }

    char *outEnd = _outBuffer;

    if (_format == XDR)
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		if (modp (y, cd.ys) != 0)
		    continue;

		if (cd.type == HALF)
		{
		    for (int x = cd.nx; x > 0; --x)
		    {
			Xdr::write <CharPtrIO> (outEnd, *cd.end);
			++cd.end;
		    }
		}
		else
		{
		    int n = cd.nx * cd.size;
		    memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		    outEnd += n * sizeof (unsigned short);
		    cd.end += n;
		}
	    }
	}
    }
    else
    {
	for (int y = minY; y <= maxY; ++y)
	{
	    for (int i = 0; i < _numChans; ++i)
	    {
		ChannelData &cd = _channelData[i];

		#if defined (DEBUG)
		    assert (cd.type == HALF);
		#endif

		if (modp (y, cd.ys) != 0)
		    continue;

		int n = cd.nx * cd.size;
		memcpy (outEnd, cd.end, n * sizeof (unsigned short));
		outEnd += n * sizeof (unsigned short);
		cd.end += n;
	    }
	}
    }

    #if defined (DEBUG)

	for (int i = 1; i < _numChans; ++i)
	    assert (_channelData[i-1].end == _channelData[i].start);

	assert (_channelData[_numChans-1].end == tmpBufferEnd);

    #endif

    if (inSize > 0)
	tooMuchData();

    outPtr = _outBuffer;
    return outEnd - _outBuffer;
}